

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O2

void __thiscall ast::Inst_mrs::~Inst_mrs(Inst_mrs *this)

{
  Statement::~Statement((Statement *)this);
  operator_delete(this);
  return;
}

Assistant:

Inst_mrs(Register *rd, Register *rs, Location left) :
		Instruction {left}, rd {rd}, rs {rs} { }